

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECTest_SpecifiedCurve_Test::TestBody(ECTest_SpecifiedCurve_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  EC_GROUP *group;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  UniquePtr<EC_KEY> key;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  Bytes local_68;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_30;
  pointer local_28;
  _Head_base<0UL,_ec_key_st_*,_false> local_20;
  AssertHelper local_18;
  
  DecodeECPrivateKey((anon_unknown_dwarf_5c29f0 *)&local_20,
                     (anonymous_namespace)::kECKeySpecifiedCurve,0x126);
  auVar1 = local_38;
  local_38[0] = local_20._M_head_impl != (EC_KEY *)0x0;
  pbStack_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20._M_head_impl == (EC_KEY *)0x0) {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_38,(AssertionResult *)0x607821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x109,(char *)CONCAT71(local_58._1_7_,local_58[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
    }
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
    if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_30,pbStack_30);
    }
  }
  else {
    local_38._4_4_ = auVar1._4_4_;
    local_38._0_4_ = 0x19f;
    group = EC_KEY_get0_group((EC_KEY *)local_20._M_head_impl);
    local_78._0_4_ = EC_GROUP_get_curve_name(group);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"415","EC_GROUP_get_curve_name(EC_KEY_get0_group(key.get()))",
               (int *)local_38,(int *)local_78);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_38);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x10d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )local_38 !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    local_38 = (undefined1  [8])0x0;
    pbStack_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_28 = (pointer)0x0;
    bVar2 = EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                               local_20._M_head_impl);
    local_78[0] = bVar2;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)local_78,
                 (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x111,(char *)CONCAT71(local_58._1_7_,local_58[0]));
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_68.span_.data_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68.span_.data_ + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    local_78 = (undefined1  [8])&(anonymous_namespace)::kECKeyWithoutPublic;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33;
    local_68.span_.size_ = (long)pbStack_30 - (long)local_38;
    local_68.span_.data_ = (uchar *)local_38;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_58,"Bytes(kECKeyWithoutPublic)","Bytes(out.data(), out.size())",
               (Bytes *)local_78,&local_68);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_78);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x112,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_78 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_78 + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (local_38 != (undefined1  [8])0x0) {
      operator_delete((void *)local_38,(long)local_28 - (long)local_38);
    }
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_20);
  return;
}

Assistant:

TEST(ECTest, SpecifiedCurve) {
  // Test keys with specified curves may be decoded.
  bssl::UniquePtr<EC_KEY> key =
      DecodeECPrivateKey(kECKeySpecifiedCurve, sizeof(kECKeySpecifiedCurve));
  ASSERT_TRUE(key);

  // The group should have been interpreted as P-256.
  EXPECT_EQ(NID_X9_62_prime256v1,
            EC_GROUP_get_curve_name(EC_KEY_get0_group(key.get())));

  // Encoding the key should still use named form.
  std::vector<uint8_t> out;
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithoutPublic), Bytes(out.data(), out.size()));
}